

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.hpp
# Opt level: O1

void __thiscall henson::Scheduler::finish(Scheduler *this)

{
  spdlog::logger::log((this->log_).super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr,0.0);
  while ((this->active_jobs_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    check_for_complete_jobs(this);
  }
  log_job_times(this);
  signal_stop(this);
  return;
}

Assistant:

void    finish()
        {
            log_->debug("Finishing scheduler controller");
            while (unfinished_jobs())
                check_for_complete_jobs();

            log_job_times();
            signal_stop();
        }